

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_avx2.c
# Opt level: O0

void iadst16_stage4_avx2(__m256i *x,int32_t *cospi,__m256i _r,int8_t cos_bit)

{
  __m256i w1;
  __m256i w1_00;
  __m256i w1_01;
  __m256i w1_02;
  __m256i w0;
  __m256i w0_00;
  __m256i w0_01;
  __m256i w0_02;
  __m256i cospi_m24_p40;
  __m256i cospi_m56_p08;
  __m256i cospi_p24_m40;
  __m256i cospi_p40_p24;
  __m256i cospi_p56_m08;
  __m256i cospi_p08_p56;
  __m256i *in_stack_000000c8;
  __m256i *in_stack_000000d0;
  undefined7 in_stack_000000d8;
  longlong in_stack_00000110;
  undefined4 uVar1;
  undefined8 in_stack_fffffffffffffed0;
  
  uVar1 = (undefined4)in_stack_fffffffffffffed0;
  pair_set_w16_epi16((int16_t)((ulong)in_stack_fffffffffffffed0 >> 0x10),
                     (int16_t)in_stack_fffffffffffffed0);
  pair_set_w16_epi16((int16_t)((uint)uVar1 >> 0x10),(int16_t)uVar1);
  pair_set_w16_epi16((int16_t)((uint)uVar1 >> 0x10),(int16_t)uVar1);
  pair_set_w16_epi16((int16_t)((uint)uVar1 >> 0x10),(int16_t)uVar1);
  pair_set_w16_epi16((int16_t)((uint)uVar1 >> 0x10),(int16_t)uVar1);
  pair_set_w16_epi16((int16_t)((uint)uVar1 >> 0x10),(int16_t)uVar1);
  w0[1] = (longlong)cospi;
  w0[0] = _r[3];
  w0[2] = (longlong)x;
  w0[3] = in_stack_00000110;
  w1[0]._7_1_ = cos_bit;
  w1[0]._0_7_ = in_stack_000000d8;
  w1[1] = _r[0];
  w1[2] = _r[1];
  w1[3] = _r[2];
  btf_16_w16_avx2(w0,w1,in_stack_000000d0,in_stack_000000c8,(__m256i)stack0x00000098,
                  cospi_p56_m08[2]._4_4_);
  w0_00[1] = (longlong)cospi;
  w0_00[0] = _r[3];
  w0_00[2] = (longlong)x;
  w0_00[3] = in_stack_00000110;
  w1_00[0]._7_1_ = cos_bit;
  w1_00[0]._0_7_ = in_stack_000000d8;
  w1_00[1] = _r[0];
  w1_00[2] = _r[1];
  w1_00[3] = _r[2];
  btf_16_w16_avx2(w0_00,w1_00,in_stack_000000d0,in_stack_000000c8,(__m256i)stack0x00000098,
                  cospi_p56_m08[2]._4_4_);
  w0_01[1] = (longlong)cospi;
  w0_01[0] = _r[3];
  w0_01[2] = (longlong)x;
  w0_01[3] = in_stack_00000110;
  w1_01[0]._7_1_ = cos_bit;
  w1_01[0]._0_7_ = in_stack_000000d8;
  w1_01[1] = _r[0];
  w1_01[2] = _r[1];
  w1_01[3] = _r[2];
  btf_16_w16_avx2(w0_01,w1_01,in_stack_000000d0,in_stack_000000c8,(__m256i)stack0x00000098,
                  cospi_p56_m08[2]._4_4_);
  w0_02[1] = (longlong)cospi;
  w0_02[0] = _r[3];
  w0_02[2] = (longlong)x;
  w0_02[3] = in_stack_00000110;
  w1_02[0]._7_1_ = cos_bit;
  w1_02[0]._0_7_ = in_stack_000000d8;
  w1_02[1] = _r[0];
  w1_02[2] = _r[1];
  w1_02[3] = _r[2];
  btf_16_w16_avx2(w0_02,w1_02,in_stack_000000d0,in_stack_000000c8,(__m256i)stack0x00000098,
                  cospi_p56_m08[2]._4_4_);
  return;
}

Assistant:

static inline void iadst16_stage4_avx2(__m256i *x, const int32_t *cospi,
                                       const __m256i _r, int8_t cos_bit) {
  const __m256i cospi_p08_p56 = pair_set_w16_epi16(cospi[8], cospi[56]);
  const __m256i cospi_p56_m08 = pair_set_w16_epi16(cospi[56], -cospi[8]);
  const __m256i cospi_p40_p24 = pair_set_w16_epi16(cospi[40], cospi[24]);
  const __m256i cospi_p24_m40 = pair_set_w16_epi16(cospi[24], -cospi[40]);
  const __m256i cospi_m56_p08 = pair_set_w16_epi16(-cospi[56], cospi[8]);
  const __m256i cospi_m24_p40 = pair_set_w16_epi16(-cospi[24], cospi[40]);
  btf_16_w16_avx2(cospi_p08_p56, cospi_p56_m08, &x[8], &x[9], _r, cos_bit);
  btf_16_w16_avx2(cospi_p40_p24, cospi_p24_m40, &x[10], &x[11], _r, cos_bit);
  btf_16_w16_avx2(cospi_m56_p08, cospi_p08_p56, &x[12], &x[13], _r, cos_bit);
  btf_16_w16_avx2(cospi_m24_p40, cospi_p40_p24, &x[14], &x[15], _r, cos_bit);
}